

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

void __thiscall Parser::parseLine(Parser *this)

{
  TokenStream *this_00;
  undefined1 *puVar1;
  Token *pTVar2;
  undefined4 uVar3;
  int iVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  iterator iVar6;
  undefined8 extraout_RAX;
  Type TVar7;
  Parser *pPVar8;
  Token nextToken;
  Token colonToken;
  Token keywordToken;
  AstNode instructionNode;
  Token labelToken;
  Token token_4;
  Token token_2;
  undefined1 local_300 [16];
  _Alloc_hider local_2f0;
  size_type local_2e8;
  char local_2e0 [16];
  undefined1 local_2d0 [16];
  _Alloc_hider local_2c0;
  _Alloc_hider local_2b8;
  char local_2b0 [8];
  char local_2a8 [16];
  vector<AstNode,_std::allocator<AstNode>_> local_298;
  Token local_280;
  undefined1 local_250 [16];
  _Alloc_hider _Stack_240;
  _Alloc_hider local_238;
  undefined1 local_230 [24];
  vector<AstNode,_std::allocator<AstNode>_> local_218;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  undefined1 local_180 [32];
  __node_base_ptr local_160 [2];
  undefined1 local_150 [32];
  __node_base local_130 [2];
  undefined1 local_120 [32];
  __node_base_ptr local_100 [2];
  Token local_f0;
  undefined1 local_c0 [16];
  _Alloc_hider local_b0;
  char local_a0 [16];
  Token local_90;
  Token local_60;
  
  peekToken((Token *)local_c0,this);
  if (local_c0._0_4_ == IdentifierToken) {
    TokenStream::getTokenAt((Token *)local_250,&this->_tokenStream,(long)this->_currentTokenNo);
    this->_currentTokenNo = this->_currentTokenNo + 1;
    local_c0._8_4_ = local_250._8_4_;
    std::__cxx11::string::operator=((string *)&local_b0,(string *)&_Stack_240);
    if (_Stack_240._M_p != local_230) {
      operator_delete(_Stack_240._M_p);
    }
    TokenStream::getTokenAt((Token *)local_2d0,&this->_tokenStream,(long)this->_currentTokenNo);
    this->_currentTokenNo = this->_currentTokenNo + 1;
    if ((local_2d0._0_4_ == DelimiterToken) &&
       (iVar4 = std::__cxx11::string::compare((char *)&local_2c0), iVar4 == 0)) {
      local_250._0_4_ = IdentifierToken;
      local_250._8_8_ = 0;
      _Stack_240._M_p = (pointer)0x0;
      local_230._0_8_ = 0;
      local_230[8] = '\0';
      local_218.super__Vector_base<AstNode,_std::allocator<AstNode>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_218.super__Vector_base<AstNode,_std::allocator<AstNode>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_218.super__Vector_base<AstNode,_std::allocator<AstNode>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_238._M_p = local_230 + 8;
      std::__cxx11::string::_M_assign((string *)&local_238);
      std::vector<AstNode,_std::allocator<AstNode>_>::emplace_back<AstNode>
                (&(this->_ast).rootNode.children,(AstNode *)local_250);
      std::vector<AstNode,_std::allocator<AstNode>_>::~vector(&local_218);
      if (local_238._M_p != local_230 + 8) {
        operator_delete(local_238._M_p);
      }
      if (local_2c0._M_p != local_2b0) {
        operator_delete(local_2c0._M_p);
      }
      goto LAB_00109592;
    }
    local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"colon expected","");
    pPVar8 = (Parser *)&local_f0.tokenData;
    local_f0.columnNumber = local_2d0._8_4_;
    local_f0.tokenData._M_dataplus._M_p = (pointer)&local_f0.tokenData.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)pPVar8,local_2c0._M_p,local_2b8._M_p + (long)local_2c0._M_p);
    parserError(pPVar8,&local_1a0,&local_f0);
LAB_001098de:
    local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"keyword expected","");
    pPVar8 = (Parser *)(local_120 + 0x10);
    local_120._8_4_ = local_280.columnNumber;
    local_120._16_8_ = local_100;
    std::__cxx11::string::_M_construct<char*>
              ((string *)pPVar8,local_280.tokenData._M_dataplus._M_p,
               local_280.tokenData._M_dataplus._M_p + local_280.tokenData._M_string_length);
    parserError(pPVar8,&local_1c0,(Token *)local_120);
  }
  else {
LAB_00109592:
    peekToken((Token *)local_250,this);
    uVar3 = local_250._0_4_;
    if (_Stack_240._M_p != local_230) {
      operator_delete(_Stack_240._M_p);
    }
    if (uVar3 == LineTerminatorToken) {
      TokenStream::getTokenAt(&local_60,&this->_tokenStream,(long)this->_currentTokenNo);
      this->_currentTokenNo = this->_currentTokenNo + 1;
      pTVar2 = &local_60;
LAB_00109836:
      paVar5 = &(pTVar2->tokenData).field_2;
      puVar1 = *(undefined1 **)(paVar5->_M_local_buf + -0x10);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar1 != paVar5) {
        operator_delete(puVar1);
      }
      if (local_b0._M_p != local_a0) {
        operator_delete(local_b0._M_p);
      }
      return;
    }
    this_00 = &this->_tokenStream;
    TokenStream::getTokenAt(&local_280,this_00,(long)this->_currentTokenNo);
    this->_currentTokenNo = this->_currentTokenNo + 1;
    if (local_280.type != KeywordToken) goto LAB_001098de;
    local_238._M_p = local_230 + 8;
    local_250._0_4_ = NullToken;
    local_250._8_8_ = 0;
    _Stack_240._M_p = (pointer)0x0;
    local_230._0_8_ = 0;
    local_230[8] = '\0';
    local_218.super__Vector_base<AstNode,_std::allocator<AstNode>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_218.super__Vector_base<AstNode,_std::allocator<AstNode>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_218.super__Vector_base<AstNode,_std::allocator<AstNode>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    iVar6 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    *)this,&local_280.tokenData);
    TVar7 = DelimiterToken;
    if (iVar6.
        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      iVar6 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::find(&(this->_instructions)._M_h,&local_280.tokenData);
      TVar7 = NumberToken;
      if (iVar6.
          super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          ._M_cur == (__node_type *)0x0) goto LAB_001099ce;
    }
    local_250._0_4_ = TVar7;
    std::__cxx11::string::_M_assign((string *)&local_238);
    peekToken((Token *)local_300,this);
    if (local_300._0_4_ == DelimiterToken) {
      do {
        iVar4 = std::__cxx11::string::compare((char *)&local_2f0);
        if (iVar4 != 0) break;
        TokenStream::getTokenAt(&local_90,this_00,(long)this->_currentTokenNo);
        this->_currentTokenNo = this->_currentTokenNo + 1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90.tokenData._M_dataplus._M_p != &local_90.tokenData.field_2) {
          operator_delete(local_90.tokenData._M_dataplus._M_p);
        }
        peekToken((Token *)local_2d0,this);
        uVar3 = local_2d0._0_4_;
        if (local_2c0._M_p != local_2b0) {
          operator_delete(local_2c0._M_p);
        }
        if (uVar3 != LineTerminatorToken) {
          parseExpression((AstNode *)local_2d0,this);
          std::vector<AstNode,_std::allocator<AstNode>_>::push_back(&local_218,(AstNode *)local_2d0)
          ;
          std::vector<AstNode,_std::allocator<AstNode>_>::~vector(&local_298);
          if (local_2b8._M_p != local_2a8) {
            operator_delete(local_2b8._M_p);
          }
        }
        peekToken((Token *)local_2d0,this);
        local_300._8_4_ = local_2d0._8_4_;
        local_300._0_4_ = local_2d0._0_4_;
        std::__cxx11::string::operator=((string *)&local_2f0,(string *)&local_2c0);
        if (local_2c0._M_p != local_2b0) {
          operator_delete(local_2c0._M_p);
        }
      } while (local_300._0_4_ == DelimiterToken);
    }
    std::vector<AstNode,_std::allocator<AstNode>_>::push_back
              (&(this->_ast).rootNode.children,(value_type *)local_250);
    TokenStream::getTokenAt((Token *)local_2d0,this_00,(long)this->_currentTokenNo);
    this->_currentTokenNo = this->_currentTokenNo + 1;
    local_300._8_4_ = local_2d0._8_4_;
    local_300._4_4_ = local_2d0._4_4_;
    local_300._0_4_ = local_2d0._0_4_;
    std::__cxx11::string::operator=((string *)&local_2f0,(string *)&local_2c0);
    if (local_2c0._M_p != local_2b0) {
      operator_delete(local_2c0._M_p);
    }
    if (local_300._0_4_ == LineTerminatorToken) {
      if (local_2f0._M_p != local_2e0) {
        operator_delete(local_2f0._M_p);
      }
      std::vector<AstNode,_std::allocator<AstNode>_>::~vector(&local_218);
      if (local_238._M_p != local_230 + 8) {
        operator_delete(local_238._M_p);
      }
      pTVar2 = &local_280;
      goto LAB_00109836;
    }
  }
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_200,"line terminator expected","");
  pPVar8 = (Parser *)(local_180 + 0x10);
  local_180._8_4_ = local_300._8_4_;
  local_180._0_8_ = local_300._0_8_;
  local_180._16_8_ = local_160;
  std::__cxx11::string::_M_construct<char*>
            ((string *)pPVar8,local_2f0._M_p,local_2f0._M_p + local_2e8);
  parserError(pPVar8,&local_200,(Token *)local_180);
LAB_001099ce:
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"unrecognized keyword","");
  pPVar8 = (Parser *)(local_150 + 0x10);
  local_150._8_4_ = local_280.columnNumber;
  local_150._16_8_ = local_130;
  std::__cxx11::string::_M_construct<char*>
            ((string *)pPVar8,local_280.tokenData._M_dataplus._M_p,
             local_280.tokenData._M_dataplus._M_p + local_280.tokenData._M_string_length);
  parserError(pPVar8,&local_1e0,(Token *)local_150);
  if ((__node_base *)local_150._16_8_ != local_130) {
    operator_delete((void *)local_150._16_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p);
  }
  AstNode::~AstNode((AstNode *)local_250);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280.tokenData._M_dataplus._M_p != &local_280.tokenData.field_2) {
    operator_delete(local_280.tokenData._M_dataplus._M_p);
  }
  if (local_b0._M_p != local_a0) {
    operator_delete(local_b0._M_p);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void Parser::parseLine() {
    Token labelToken = peekToken();

    // Parse label (optional)

    if(labelToken.type == Token::IdentifierToken) {
        labelToken = readToken();
        Token colonToken = readToken();

        if(colonToken.type != Token::DelimiterToken || colonToken.tokenData != ":") {
            parserError("colon expected", colonToken);
        }

        auto labelNode = AstNode{AstNode::LabelNode};
        labelNode.sValue = labelToken.tokenData;
        _ast.rootNode.children.push_back(std::move(labelNode));
    }

    // Parse keyword

    if(peekToken().type == Token::LineTerminatorToken) {
        readToken(); // Line with just label
        return;
    }

    Token keywordToken = readToken();

    if(keywordToken.type != Token::KeywordToken) {
        parserError("keyword expected", keywordToken);
    }

    AstNode instructionNode;
    if(_directives.find(keywordToken.tokenData) != _directives.end()) {
        instructionNode.type = AstNode::DirectiveNode;
    } else if(_instructions.find(keywordToken.tokenData) != _instructions.end()) {
        instructionNode.type = AstNode::InstructionNode;
    } else {
        parserError("unrecognized keyword", keywordToken);
    }

    instructionNode.sValue = keywordToken.tokenData;

    // Parse args

    Token nextToken = peekToken();

    while(nextToken.type == Token::DelimiterToken && nextToken.tokenData == ",") {
        readToken();
        if(peekToken().type != Token::LineTerminatorToken) {
            AstNode expressionNode = parseExpression();
            instructionNode.children.push_back(expressionNode);
        }
        nextToken = peekToken();
    }

    _ast.rootNode.children.push_back(instructionNode);

    nextToken = readToken();
    if(nextToken.type != Token::LineTerminatorToken) {
        parserError("line terminator expected", nextToken);
    }

}